

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgen.cc
# Opt level: O3

int main(int argc,char **argv)

{
  string *psVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  Grammar *grammar_00;
  bool bVar2;
  size_type sVar3;
  long lVar4;
  int iVar5;
  char **in_RSI;
  char *pcVar6;
  int in_EDI;
  vector<Token,_std::allocator<Token>_> verbatim;
  Grammar *grammar;
  vector<Token,_std::allocator<Token>_> tokens;
  DisposeAST disposeAST;
  ofstream out;
  GenParser gen;
  int local_464;
  char **local_460;
  vector<Token,_std::allocator<Token>_> local_458;
  Grammar *local_440;
  vector<Token,_std::allocator<Token>_> local_438;
  string local_420;
  DisposeAST local_400;
  vector<Token,_std::allocator<Token>_> local_3f8;
  Parser local_3d8;
  undefined1 local_3a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390 [14];
  ios_base local_2a8 [272];
  GenParser local_198;
  ios_base local_128 [264];
  
  local_464 = in_EDI;
  local_460 = in_RSI;
  local_3a0._0_8_ = local_390;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"1.0","");
  gflags::SetVersionString((string *)local_3a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._0_8_ != local_390) {
    operator_delete((void *)local_3a0._0_8_,local_390[0]._M_allocated_capacity + 1);
  }
  local_3a0._0_8_ = local_390;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"pgen [options] file","");
  gflags::SetUsageMessage((string *)local_3a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._0_8_ != local_390) {
    operator_delete((void *)local_3a0._0_8_,local_390[0]._M_allocated_capacity + 1);
  }
  gflags::ParseCommandLineFlags(&local_464,&local_460,true);
  args = fLS::FLAGS_input_abi_cxx11_;
  sVar3 = fLS::FLAGS_input_abi_cxx11_->_M_string_length;
  if ((sVar3 == 0) && (1 < local_464)) {
    pcVar6 = local_460[1];
    strlen(pcVar6);
    std::__cxx11::string::_M_replace((ulong)args,0,(char *)0x0,(ulong)pcVar6);
    sVar3 = args->_M_string_length;
  }
  psVar1 = fLS::FLAGS_o_abi_cxx11_;
  if (sVar3 == 0) {
    lVar4 = 0x13;
    pcVar6 = "pgen: no input file";
  }
  else {
    if (*(long *)(fLS::FLAGS_o_abi_cxx11_ + 8) != 0) {
      local_458.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_458.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_458.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::ifstream::ifstream(local_3a0,(string *)args,_S_in);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
      std::ostream::operator<<((ostream *)&local_198,(streambuf *)local_390[0]._M_local_buf);
      std::ifstream::close();
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
      std::ios_base::~ios_base(local_128);
      std::ifstream::~ifstream(local_3a0);
      Lexer::tokenize(&local_438,&local_420,&local_458);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_420._M_dataplus._M_p != &local_420.field_2) {
        operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
      }
      std::vector<Token,_std::allocator<Token>_>::vector(&local_3f8,&local_438);
      local_3d8.tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_3f8.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_3d8.tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_3f8.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_3d8.tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_3f8.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_3f8.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_3f8.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_3f8.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_3d8.grammar_ = (Grammar *)0x0;
      local_3d8.yyinvalid = true;
      local_3d8.yytok = 0;
      local_3d8.yydepth = -1;
      local_3d8.yycursor = 0;
      std::vector<Token,_std::allocator<Token>_>::~vector(&local_3f8);
      local_440 = (Grammar *)0x0;
      bVar2 = Parser::parse_grammar(&local_3d8,&local_440);
      grammar_00 = local_440;
      if (bVar2) {
        iVar5 = 1;
        if ((local_440->undef)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
          std::ofstream::ofstream(local_3a0,psVar1,_S_out);
          GenParser::GenParser(&local_198,(ostream *)local_3a0);
          GenParser::operator()(&local_198,grammar_00,&local_458);
          local_400.super_Visitor._vptr_Visitor = (Visitor)&PTR__Visitor_00135d98;
          ast::DisposeAST::operator()(&local_400,&grammar_00->super_Node);
          local_3a0._0_8_ = _VTT;
          *(undefined8 *)(local_3a0 + *(long *)(_VTT->_M_local_buf + -0x18)) =
               ___throw_bad_array_new_length;
          std::filebuf::~filebuf((filebuf *)(local_3a0 + 8));
          std::ios_base::~ios_base(local_2a8);
          iVar5 = 0;
        }
      }
      else {
        fmt::v7::print<char[33],std::__cxx11::string&,int&,char>
                  ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
                   (char (*) [33])"{0}:{1}: error: unexpected token",args,
                   &local_438.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                    super__Vector_impl_data._M_start[local_3d8.yycursor].line);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
        std::ostream::put(' ');
        iVar5 = 1;
        std::ostream::flush();
      }
      std::vector<Token,_std::allocator<Token>_>::~vector(&local_3d8.tokens);
      std::vector<Token,_std::allocator<Token>_>::~vector(&local_438);
      std::vector<Token,_std::allocator<Token>_>::~vector(&local_458);
      goto LAB_0010e40e;
    }
    lVar4 = 0x14;
    pcVar6 = "pgen: no output file";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar6,lVar4);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
  std::ostream::put(' ');
  iVar5 = 1;
  std::ostream::flush();
LAB_0010e40e:
  gflags::ShutDownCommandLineFlags();
  return iVar5;
}

Assistant:

int main(int argc, char* argv[]) {
  FlagsScope flagsScope;

  gflags::SetVersionString("1.0");
  gflags::SetUsageMessage("pgen [options] file");
  gflags::ParseCommandLineFlags(&argc, &argv, true);

  if (FLAGS_input.empty() && argc > 1) FLAGS_input = argv[1];

  if (FLAGS_input.empty()) {
    std::cerr << "pgen: no input file" << std::endl;
    return EXIT_FAILURE;
  }

  if (FLAGS_o.empty()) {
    std::cerr << "pgen: no output file" << std::endl;
    return EXIT_FAILURE;
  }

  std::vector<Token> verbatim;

  std::vector<Token> tokens = Lexer::tokenize(ReadFile(FLAGS_input), &verbatim);

  Parser parser(tokens);

  ast::Grammar* grammar = nullptr;
  if (!parser.parse_grammar(grammar)) {
    fmt::print(std::cerr, "{0}:{1}: error: unexpected token", FLAGS_input,
               tokens[parser.yycursor].line);
    std::cerr << std::endl;
    return EXIT_FAILURE;
  }

  if (!grammar->undef.empty()) {
    return EXIT_FAILURE;
  }

  std::ofstream out(FLAGS_o);

  GenParser gen(out);
  gen(grammar, verbatim);

  ast::DisposeAST disposeAST;
  disposeAST(grammar);

  return EXIT_SUCCESS;
}